

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory_computer.h
# Opt level: O3

void directed_flag_complex_in_memory_computer::
     prepare_graph_filtration<directed_flag_complex_in_memory_t<std::pair<int,float>>>
               (directed_flag_complex_in_memory_t<std::pair<int,_float>_> *complex,
               filtered_directed_graph_t *graph,filtration_algorithm_t *filtration_algorithm,
               size_t nb_threads)

{
  pointer pfVar1;
  pointer pfVar2;
  unsigned_short *puVar3;
  float *pfVar4;
  pointer pvVar5;
  filtered_directed_graph_t *pfVar6;
  directed_flag_complex_in_memory_t<std::pair<int,_float>_> *pdVar7;
  ushort uVar8;
  int iVar9;
  ostream *poVar10;
  size_t sVar11;
  bool bVar12;
  long lVar13;
  unsigned_short *puVar14;
  float *pfVar15;
  pointer puVar16;
  long lVar17;
  ulong uVar18;
  float extraout_XMM0_Da;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  new_filtrations;
  vector<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
  reorder_filtration;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  new_edges;
  vector<float,_std::allocator<float>_> local_d8;
  vector<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
  local_b8;
  size_t local_98;
  directed_flag_complex_in_memory_t<std::pair<int,_float>_> *local_90;
  compute_filtration_t local_88;
  reorder_edges_t local_48;
  
  local_98 = nb_threads;
  local_90 = complex;
  if (filtration_algorithm == (filtration_algorithm_t *)0x0) {
    local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)((ulong)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start & 0xffffffff00000000);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&local_88,
               (long)(graph->vertex_filtration).super__Vector_base<float,_std::allocator<float>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(graph->vertex_filtration).super__Vector_base<float,_std::allocator<float>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 2,(value_type_conflict2 *)&local_d8
               ,(allocator_type *)&local_b8);
    pfVar1 = (graph->vertex_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar2 = (graph->vertex_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (graph->vertex_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_88._0_8_;
    (graph->vertex_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_88.filtration_algorithm;
    (graph->vertex_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_88.graph;
    local_88._0_8_ = (pointer)0x0;
    local_88.filtration_algorithm = (filtration_algorithm_t *)0x0;
    local_88.graph = (filtered_directed_graph_t *)0x0;
    if (pfVar1 != (pointer)0x0) {
      operator_delete(pfVar1,(long)pfVar2 - (long)pfVar1);
      pvVar5 = (pointer)local_88._0_8_;
      pfVar6 = local_88.graph;
      goto joined_r0x0013553a;
    }
  }
  else {
    iVar9 = (*filtration_algorithm->_vptr_filtration_algorithm_t[3])(filtration_algorithm);
    if ((char)iVar9 != '\0') {
      local_88._0_8_ = &PTR_vertex_00151288;
      local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((ulong)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_start & 0xffffffffffff0000);
      if ((graph->super_directed_graph_t).number_of_vertices != 0) {
        do {
          local_88.filtration_algorithm = (filtration_algorithm_t *)&local_d8;
          (*filtration_algorithm->_vptr_filtration_algorithm_t[2])
                    (filtration_algorithm,0,&local_88,graph);
          (graph->vertex_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start
          [(ulong)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start & 0xffff] = extraout_XMM0_Da;
          uVar8 = (short)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start + 1;
          local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)CONCAT62(local_d8.super__Vector_base<float,_std::allocator<float>_>.
                                        _M_impl.super__Vector_impl_data._M_start._2_6_,uVar8);
        } while (uVar8 < (graph->super_directed_graph_t).number_of_vertices);
      }
    }
    if (((graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish !=
         (graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_start) &&
       (iVar9 = (*filtration_algorithm->_vptr_filtration_algorithm_t[4])(filtration_algorithm),
       pdVar7 = local_90, (char)iVar9 == '\0')) {
      puVar16 = (graph->super_directed_graph_t).edges.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start;
      bVar12 = true;
      if (2 < (ulong)((long)(graph->super_directed_graph_t).edges.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar16)) {
        pfVar1 = (graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar18 = 0;
        do {
          directed_flag_complex_cell_in_memory_t<std::pair<int,float>>::set_data<unsigned_short*>
                    ((directed_flag_complex_cell_in_memory_t<std::pair<int,float>> *)
                     ((long)&((pdVar7->vertex_cells).
                              super__Vector_base<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->vertex +
                     (ulong)((uint)*puVar16 * 0x18)),1,puVar16,
                     (pair<int,_float>)((ulong)(uint)pfVar1[uVar18] << 0x20 | 0xffffffff),0);
          uVar18 = uVar18 + 1;
          puVar16 = puVar16 + 2;
          nb_threads = local_98;
        } while (uVar18 < (ulong)((long)(graph->super_directed_graph_t).edges.
                                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(graph->super_directed_graph_t).edges.
                                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 1) >> 1);
      }
      goto LAB_0013554b;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"computing the filtration of all edges",0x25);
    poVar10 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\r",1);
    local_88.current_index = 0xffffffff;
    local_88.boundary_filtration = (value_t *)0x0;
    local_88.next_filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.next_filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.next_filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.filtration_algorithm = filtration_algorithm;
    local_88.graph = graph;
    local_88.complex = complex;
    directed_flag_complex_in_memory_t<std::pair<int,_float>_>::
    for_each_cell<directed_flag_complex_in_memory_computer::compute_filtration_t>
              (complex,&local_88,1,-1);
    pfVar1 = (graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish != pfVar1) {
      (graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = pfVar1;
    }
    std::vector<float,_std::allocator<float>_>::vector(&local_d8,&local_88.next_filtration);
    pfVar1 = (graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar2 = (graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start;
    (graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    (graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    pvVar5 = (pointer)local_88.next_filtration.super__Vector_base<float,_std::allocator<float>_>.
                      _M_impl.super__Vector_impl_data._M_start;
    pfVar6 = (filtered_directed_graph_t *)
             local_88.next_filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if ((pfVar1 != (pointer)0x0) &&
       (operator_delete(pfVar1,(long)pfVar2 - (long)pfVar1),
       pvVar5 = (pointer)local_88.next_filtration.super__Vector_base<float,_std::allocator<float>_>.
                         _M_impl.super__Vector_impl_data._M_start,
       pfVar6 = (filtered_directed_graph_t *)
                local_88.next_filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
       local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_start != (pointer)0x0)) {
      operator_delete(local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
      pvVar5 = (pointer)local_88.next_filtration.super__Vector_base<float,_std::allocator<float>_>.
                        _M_impl.super__Vector_impl_data._M_start;
      pfVar6 = (filtered_directed_graph_t *)
               local_88.next_filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
joined_r0x0013553a:
    if (pvVar5 != (pointer)0x0) {
      operator_delete(pvVar5,(long)pfVar6 - (long)pvVar5);
    }
  }
  bVar12 = false;
LAB_0013554b:
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::vector((vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
            *)&local_88,nb_threads,(allocator_type *)&local_d8);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            *)&local_d8,nb_threads,(allocator_type *)&local_b8);
  local_b8.
  super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = (reorder_edges_t *)0x0;
  local_b8.
  super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (reorder_edges_t *)0x0;
  if (nb_threads != 0) {
    lVar17 = 0;
    sVar11 = local_98;
    do {
      local_48.new_edges =
           (vector<unsigned_short,_std::allocator<unsigned_short>_> *)
           ((long)&(((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)local_88._0_8_
                    )->_M_impl).super__Vector_impl_data._M_start + lVar17);
      local_48.new_filtration =
           (vector<float,_std::allocator<float>_> *)
           ((long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar17);
      local_48.reorder_filtration = bVar12;
      if (local_b8.
          super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_b8.
          super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
        ::_M_realloc_insert<directed_flag_complex_in_memory_computer::reorder_edges_t>
                  (&local_b8,
                   (iterator)
                   local_b8.
                   super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_48);
      }
      else {
        *(ulong *)&(local_b8.
                    super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->reorder_filtration =
             CONCAT71(local_48._17_7_,bVar12);
        (local_b8.
         super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
         ._M_impl.super__Vector_impl_data._M_finish)->new_edges = local_48.new_edges;
        (local_b8.
         super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
         ._M_impl.super__Vector_impl_data._M_finish)->new_filtration = local_48.new_filtration;
        local_b8.
        super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_b8.
             super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      lVar17 = lVar17 + 0x18;
      sVar11 = sVar11 - 1;
    } while (sVar11 != 0);
  }
  directed_flag_complex_in_memory_t<std::pair<int,_float>_>::
  for_each_cell<directed_flag_complex_in_memory_computer::reorder_edges_t>(local_90,&local_b8,1,-1);
  if (local_98 != 0) {
    puVar16 = (graph->super_directed_graph_t).edges.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start;
    pfVar1 = (graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar11 = 0;
    lVar17 = 0;
    lVar13 = 0;
    do {
      puVar3 = (((pointer)(local_88._0_8_ + sVar11 * 0x18))->
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (puVar14 = *(unsigned_short **)(local_88._0_8_ + sVar11 * 0x18); puVar14 != puVar3;
          puVar14 = puVar14 + 1) {
        puVar16[lVar17] = *puVar14;
        lVar17 = lVar17 + 1;
      }
      if (bVar12 != false) {
        pfVar4 = *(float **)
                  (local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + sVar11 * 6 + 2);
        for (pfVar15 = *(float **)
                        (local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start + sVar11 * 6); pfVar15 != pfVar4;
            pfVar15 = pfVar15 + 1) {
          pfVar1[lVar13] = *pfVar15;
          lVar13 = lVar13 + 1;
        }
      }
      sVar11 = sVar11 + 1;
    } while (sVar11 != local_98);
  }
  if (local_b8.
      super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.
                    super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.
                          super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.
                          super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *)&local_d8);
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~vector((vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
             *)&local_88);
  return;
}

Assistant:

void prepare_graph_filtration(Complex& complex, filtered_directed_graph_t& graph,
                              filtration_algorithm_t* filtration_algorithm, const size_t nb_threads) {
	if (filtration_algorithm == nullptr) {
		// All vertices get the trivial filtration value
		graph.vertex_filtration = std::vector<value_t>(graph.vertex_filtration.size(), 0);
	} else {
		if (filtration_algorithm->overwrite_vertex_filtration()) {
			directed_flag_complex_cell_t cell;
			for (vertex_index_t v = 0; v < graph.number_of_vertices; v++) {
				cell.set_vertices(&v);
				graph.vertex_filtration[v] = filtration_algorithm->compute_filtration(0, cell, graph, nullptr);
			}
		}
	}

	bool computed_edge_filtration = false;
	if (filtration_algorithm != nullptr &&
	    (graph.edge_filtration.size() == 0 || filtration_algorithm->overwrite_edge_filtration())) {
		computed_edge_filtration = true;
#ifdef INDICATE_PROGRESS
		std::cout << "\033[K"
		          << "computing the filtration of all edges" << std::flush << "\r";
#endif

		compute_filtration_t compute_filtration(filtration_algorithm, graph, complex);
		complex.for_each_cell(compute_filtration, 1);
		graph.edge_filtration.clear();
		graph.edge_filtration = compute_filtration.filtration();
	}

	// Reorder the edge filtration
	if (!computed_edge_filtration && filtration_algorithm != nullptr) {
		vertex_index_t* edge = &graph.edges[0];
		value_t* filtration = &graph.edge_filtration[0];
		for (size_t index = 0; index < graph.edge_number(); ++index, edge += 2, ++filtration) {
			complex.set_data(1, edge, std::make_pair(-1, *filtration));
		}
	}

	// Now reorder the edges
	std::vector<std::vector<vertex_index_t>> new_edges(nb_threads);
	std::vector<std::vector<value_t>> new_filtrations(nb_threads);
	std::vector<reorder_edges_t> reorder_filtration;
	for (size_t i = 0; i < nb_threads; i++)
		reorder_filtration.push_back(reorder_edges_t(new_edges[i], new_filtrations[i],
		                                             !computed_edge_filtration && filtration_algorithm != nullptr));
	complex.for_each_cell(reorder_filtration, 1);

	size_t current_filtration_index = 0;
	size_t current_edge_index = 0;
	for (size_t i = 0; i < nb_threads; i++) {
		for (auto e : new_edges[i]) graph.edges[current_edge_index++] = e;
		if (!computed_edge_filtration && filtration_algorithm != nullptr)
			for (auto f : new_filtrations[i]) graph.edge_filtration[current_filtration_index++] = f;
	}
}